

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_type_resp(Curl_easy *data,int ftpcode,ftpstate instate)

{
  connectdata *pcVar1;
  curl_trc_feat *pcVar2;
  FILEPROTO *pFVar3;
  CURLcode CVar4;
  char *in_RAX;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  ftpstate instate_00;
  char *pcVar8;
  char *pcVar9;
  char *local_38;
  
  if (99 < ftpcode - 200U) {
    Curl_failf(data,"Couldn\'t set desired mode");
    return CURLE_FTP_COULDNT_SET_TYPE;
  }
  pcVar1 = data->conn;
  local_38 = in_RAX;
  if (((data != (Curl_easy *)0x0 && ftpcode != 200) && (((data->set).field_0x8cd & 0x10) != 0)) &&
     ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) {
    Curl_infof(data,"Got a %03d response code instead of the assumed 200");
  }
  switch(instate) {
  case '\x13':
    CVar4 = ftp_state_size(data,pcVar1);
    return CVar4;
  case '\x14':
    pcVar1 = data->conn;
    if (((data->set).ftp_filemethod == '\x02') &&
       (pFVar3 = (data->req).p.file, pFVar3->path != (char *)0x0)) {
      local_38 = (char *)0x0;
      CVar4 = Curl_urldecode(pFVar3->path,0,&local_38,(size_t *)0x0,REJECT_CTRL);
      pcVar9 = local_38;
      pcVar5 = (char *)0x0;
      if (CVar4 == CURLE_OK) {
        pcVar5 = strrchr(local_38,0x2f);
        if (pcVar5 == (char *)0x0) {
          (*Curl_cfree)(pcVar9);
          pcVar5 = (char *)0x0;
        }
        else {
          lVar6 = 1;
          if ((long)pcVar5 - (long)pcVar9 != 0) {
            lVar6 = (long)pcVar5 - (long)pcVar9;
          }
          pcVar9[lVar6] = '\0';
          pcVar5 = pcVar9;
        }
      }
      if (CVar4 != CURLE_OK) {
        return CVar4;
      }
    }
    else {
      pcVar5 = (char *)0x0;
    }
    pcVar9 = (data->set).str[0x1c];
    if ((pcVar9 == (char *)0x0) && (pcVar9 = "NLST", ((data->state).field_0x775 & 0x20) == 0)) {
      pcVar9 = "LIST";
    }
    pcVar8 = " ";
    pcVar7 = pcVar5;
    if (pcVar5 == (char *)0x0) {
      pcVar8 = "";
      pcVar7 = "";
    }
    pcVar9 = curl_maprintf("%s%s%s",pcVar9,pcVar8,pcVar7);
    (*Curl_cfree)(pcVar5);
    if (pcVar9 == (char *)0x0) {
      CVar4 = CURLE_OUT_OF_MEMORY;
    }
    else {
      CVar4 = Curl_pp_sendf(data,&(pcVar1->proto).ftpc.pp,"%s",pcVar9);
      (*Curl_cfree)(pcVar9);
      if (CVar4 == CURLE_OK) {
        _ftp_state(data,'\x1f');
      }
    }
    break;
  case '\x15':
    instate_00 = '\r';
    goto LAB_0012b3af;
  case '\x16':
    instate_00 = '\x0e';
LAB_0012b3af:
    CVar4 = ftp_state_quote(data,true,instate_00);
    return CVar4;
  default:
    CVar4 = CURLE_OK;
  }
  return CVar4;
}

Assistant:

static CURLcode ftp_state_type_resp(struct Curl_easy *data,
                                    int ftpcode,
                                    ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;

  if(ftpcode/100 != 2) {
    /* "sasserftpd" and "(u)r(x)bot ftpd" both responds with 226 after a
       successful 'TYPE I'. While that is not as RFC959 says, it is still a
       positive response code and we allow that. */
    failf(data, "Couldn't set desired mode");
    return CURLE_FTP_COULDNT_SET_TYPE;
  }
  if(ftpcode != 200)
    infof(data, "Got a %03d response code instead of the assumed 200",
          ftpcode);

  if(instate == FTP_TYPE)
    result = ftp_state_size(data, conn);
  else if(instate == FTP_LIST_TYPE)
    result = ftp_state_list(data);
  else if(instate == FTP_RETR_TYPE)
    result = ftp_state_retr_prequote(data);
  else if(instate == FTP_STOR_TYPE)
    result = ftp_state_stor_prequote(data);

  return result;
}